

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_index_build(char *fn,int min_shift)

{
  htsExactFormat hVar1;
  uint n;
  BGZF *fp;
  int iVar2;
  int iVar3;
  htsFile *fp_00;
  bam_hdr_t *h;
  ulong uVar4;
  hts_idx_t *idx;
  bam1_t *b;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int fmt;
  
  fp_00 = hts_open(fn,"r");
  if (fp_00 == (htsFile *)0x0) {
    iVar2 = -1;
  }
  else {
    hVar1 = (fp_00->format).format;
    iVar2 = -1;
    if (hVar1 == bam) {
      fp = (fp_00->fp).bgzf;
      h = bam_hdr_read(fp);
      n = h->n_targets;
      if (min_shift < 1) {
        iVar2 = 5;
        fmt = 1;
        iVar3 = 0xe;
      }
      else {
        uVar5 = 0;
        uVar7 = 0;
        if (0 < (int)n) {
          uVar7 = (ulong)n;
        }
        uVar4 = 0;
        for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          if (uVar4 <= h->target_len[uVar5]) {
            uVar4 = (ulong)h->target_len[uVar5];
          }
        }
        fmt = 0;
        iVar2 = 0;
        for (lVar6 = (long)(1 << ((byte)min_shift & 0x1f)); iVar3 = min_shift,
            lVar6 < (long)(uVar4 + 0x100); lVar6 = lVar6 << 3) {
          iVar2 = iVar2 + 1;
        }
      }
      idx = hts_idx_init(n,fmt,(ulong)(ushort)fp->block_offset | fp->block_address << 0x10,iVar3,
                         iVar2);
      bam_hdr_destroy(h);
      b = bam_init1();
      do {
        iVar2 = bam_read1(fp,b);
        if (iVar2 < 0) {
          hts_idx_finish(idx,(ulong)(ushort)fp->block_offset | fp->block_address << 0x10);
          bam_destroy1(b);
          iVar2 = -1;
          if (idx != (hts_idx_t *)0x0) {
            hts_idx_save(idx,fn,(uint)(min_shift < 1));
            hts_idx_destroy(idx);
            iVar2 = 0;
          }
          goto LAB_0012dc97;
        }
        uVar5 = *(ulong *)&(b->core).field_0x8;
        iVar3 = bam_cigar2rlen((uint)(ushort)(uVar5 >> 0x30),
                               (uint32_t *)(b->data + (uVar5 >> 0x18 & 0xff)));
        iVar2 = (b->core).pos;
        iVar2 = hts_idx_push(idx,(b->core).tid,iVar2,iVar3 + (uint)(iVar3 == 0) + iVar2,
                             (ulong)(ushort)fp->block_offset | fp->block_address << 0x10,
                             (uint)((uVar5 >> 0x22 & 1) == 0));
      } while (-1 < iVar2);
      bam_destroy1(b);
      hts_idx_destroy(idx);
      iVar2 = -1;
    }
    else if (hVar1 == cram) {
      iVar2 = cram_index_build((fp_00->fp).cram,fn);
    }
LAB_0012dc97:
    hts_close(fp_00);
  }
  return iVar2;
}

Assistant:

int bam_index_build(const char *fn, int min_shift)
{
    hts_idx_t *idx;
    htsFile *fp;
    int ret = 0;

    if ((fp = hts_open(fn, "r")) == 0) return -1;
    switch (fp->format.format) {
    case cram:
        ret = cram_index_build(fp->fp.cram, fn);
        break;

    case bam:
        idx = bam_index(fp->fp.bgzf, min_shift);
        if (idx) {
            hts_idx_save(idx, fn, (min_shift > 0)? HTS_FMT_CSI : HTS_FMT_BAI);
            hts_idx_destroy(idx);
        }
        else ret = -1;
        break;

    default:
        ret = -1;
        break;
    }
    hts_close(fp);

    return ret;
}